

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.c
# Opt level: O1

gs_val_t *
gs_c_fn_terrain_model_add_face
          (gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_val_t *vals,int num_vals)

{
  vec_gs_val_t *pvVar1;
  gs_val_t val;
  gs_val_t val_00;
  vec_int_t idx_00;
  vec_vec2_t uvs_00;
  golf_geo_face_t face_00;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  long lVar5;
  golf_geo_face_t *pgVar6;
  undefined8 *puVar7;
  long lVar8;
  long lVar9;
  byte bVar10;
  vec3 water_dir;
  vec_vec2_t uvs;
  vec_int_t idx;
  gs_val_t uv_val;
  gs_val_t sig;
  gs_val_type signature_arg_types [3];
  golf_geo_face_t face;
  undefined1 auVar11 [24];
  undefined1 in_stack_fffffffffffffe58 [96];
  char *pcVar12;
  int iVar13;
  char *pcVar14;
  char *pcVar15;
  undefined8 in_stack_fffffffffffffed0;
  char *pcVar16;
  undefined8 uStack_120;
  char *local_118;
  golf_string_t *local_110;
  vec_gs_val_t *local_108;
  gs_val_t local_100;
  gs_val_t local_e8;
  gs_val_type local_d0 [4];
  undefined1 local_c0 [144];
  
  bVar10 = 0;
  local_d0[0] = GS_VAL_STRING;
  local_d0[1] = GS_VAL_LIST;
  local_d0[2] = 6;
  gs_c_fn_signature(&local_e8,eval,vals,num_vals,local_d0,3);
  if (local_e8.is_return == true) {
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_e8.field_2._8_8_;
    __return_storage_ptr__->type = local_e8.type;
    __return_storage_ptr__->is_return = (_Bool)local_e8.is_return;
    *(int3 *)&__return_storage_ptr__->field_0x5 = local_e8._5_3_;
    (__return_storage_ptr__->field_2).vec2_val = local_e8.field_2.vec2_val;
  }
  else {
    pvVar1 = vals[1].field_2.list_val;
    local_108 = vals[2].field_2.list_val;
    if (pvVar1->length == local_108->length) {
      local_110 = (vals->field_2).string_val;
      pcVar16 = (char *)0x0;
      uStack_120 = 0;
      local_118 = "geo";
      pcVar12 = (char *)0x0;
      iVar4 = 0;
      iVar13 = 0;
      pcVar14 = "geo";
      if (0 < pvVar1->length) {
        lVar8 = 0;
        lVar9 = 0;
        do {
          val.field_2._8_8_ = *(undefined8 *)((long)&pvVar1->data->field_2 + lVar8 + 8);
          val._0_16_ = *(undefined1 (*) [16])((long)&pvVar1->data->type + lVar8);
          gs_eval_cast((gs_val_t *)local_c0,eval,val,GS_VAL_INT);
          if (local_c0[4] == true) {
            pcVar14 = "Expected an int in idx list";
            goto LAB_0011af6f;
          }
          val_00.field_2._8_8_ = *(undefined8 *)((long)&local_108->data->field_2 + lVar8 + 8);
          val_00._0_16_ = *(undefined1 (*) [16])((long)&local_108->data->type + lVar8);
          gs_eval_cast(&local_100,eval,val_00,GS_VAL_VEC2);
          _Var2 = local_100.is_return;
          if (local_100.is_return == true) {
            gs_val_error(__return_storage_ptr__,"Expected a vec2 in uv list");
          }
          else {
            iVar3 = vec_expand_((char **)&stack0xfffffffffffffed8,(int *)&uStack_120,
                                (int *)((long)&uStack_120 + 4),4,local_118);
            if (iVar3 == 0) {
              lVar5 = (long)(int)uStack_120;
              uStack_120 = CONCAT44(uStack_120._4_4_,(int)uStack_120 + 1);
              *(undefined4 *)(pcVar16 + lVar5 * 4) = local_c0._8_4_;
            }
            iVar3 = vec_expand_((char **)&stack0xfffffffffffffeb8,(int *)&stack0xfffffffffffffec0,
                                (int *)&stack0xfffffffffffffec4,8,pcVar14);
            if (iVar3 == 0) {
              lVar5 = (long)iVar4;
              iVar4 = iVar4 + 1;
              *(vec2 *)(pcVar12 + lVar5 * 8) = local_100.field_2.vec2_val;
            }
          }
          if (_Var2 != false) {
            return __return_storage_ptr__;
          }
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 0x18;
        } while (lVar9 < pvVar1->length);
      }
      water_dir = vec3_create(0.0,0.0,0.0);
      uvs_00.capacity = iVar13;
      uvs_00.length = iVar4;
      idx_00.length = (int)uStack_120;
      idx_00.capacity = uStack_120._4_4_;
      idx_00.data = (int *)pcVar16;
      idx_00.alloc_category = local_118;
      uvs_00.data = (vec2 *)pcVar12;
      uvs_00.alloc_category = pcVar14;
      pcVar15 = pcVar14;
      golf_geo_face((golf_geo_face_t *)local_c0,local_110->cstr,idx_00,GOLF_GEO_FACE_UV_GEN_MANUAL,
                    uvs_00,water_dir);
      pgVar6 = (golf_geo_face_t *)local_c0;
      puVar7 = (undefined8 *)&stack0xfffffffffffffe28;
      for (lVar8 = 0x12; lVar8 != 0; lVar8 = lVar8 + -1) {
        *puVar7 = *(undefined8 *)pgVar6;
        pgVar6 = (golf_geo_face_t *)((long)pgVar6 + (ulong)bVar10 * -0x10 + 8);
        puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
      }
      auVar11 = in_stack_fffffffffffffe58._64_24_;
      face_00.material_name[7] = in_stack_fffffffffffffe58[0];
      face_00.material_name[8] = in_stack_fffffffffffffe58[1];
      face_00.material_name[9] = in_stack_fffffffffffffe58[2];
      face_00.material_name[10] = in_stack_fffffffffffffe58[3];
      face_00.material_name[0xb] = in_stack_fffffffffffffe58[4];
      face_00.material_name[0xc] = in_stack_fffffffffffffe58[5];
      face_00.material_name[0xd] = in_stack_fffffffffffffe58[6];
      face_00.material_name[0xe] = in_stack_fffffffffffffe58[7];
      face_00.material_name[0xf] = in_stack_fffffffffffffe58[8];
      face_00.material_name[0x10] = in_stack_fffffffffffffe58[9];
      face_00.material_name[0x11] = in_stack_fffffffffffffe58[10];
      face_00.material_name[0x12] = in_stack_fffffffffffffe58[0xb];
      face_00.material_name[0x13] = in_stack_fffffffffffffe58[0xc];
      face_00.material_name[0x14] = in_stack_fffffffffffffe58[0xd];
      face_00.material_name[0x15] = in_stack_fffffffffffffe58[0xe];
      face_00.material_name[0x16] = in_stack_fffffffffffffe58[0xf];
      face_00.material_name[0x17] = in_stack_fffffffffffffe58[0x10];
      face_00.material_name[0x18] = in_stack_fffffffffffffe58[0x11];
      face_00.material_name[0x19] = in_stack_fffffffffffffe58[0x12];
      face_00.material_name[0x1a] = in_stack_fffffffffffffe58[0x13];
      face_00.material_name[0x1b] = in_stack_fffffffffffffe58[0x14];
      face_00.material_name[0x1c] = in_stack_fffffffffffffe58[0x15];
      face_00.material_name[0x1d] = in_stack_fffffffffffffe58[0x16];
      face_00.material_name[0x1e] = in_stack_fffffffffffffe58[0x17];
      face_00.material_name[0x1f] = in_stack_fffffffffffffe58[0x18];
      face_00.material_name[0x20] = in_stack_fffffffffffffe58[0x19];
      face_00.material_name[0x21] = in_stack_fffffffffffffe58[0x1a];
      face_00.material_name[0x22] = in_stack_fffffffffffffe58[0x1b];
      face_00.material_name[0x23] = in_stack_fffffffffffffe58[0x1c];
      face_00.material_name[0x24] = in_stack_fffffffffffffe58[0x1d];
      face_00.material_name[0x25] = in_stack_fffffffffffffe58[0x1e];
      face_00.material_name[0x26] = in_stack_fffffffffffffe58[0x1f];
      face_00.material_name[0x27] = in_stack_fffffffffffffe58[0x20];
      face_00.material_name[0x28] = in_stack_fffffffffffffe58[0x21];
      face_00.material_name[0x29] = in_stack_fffffffffffffe58[0x22];
      face_00.material_name[0x2a] = in_stack_fffffffffffffe58[0x23];
      face_00.material_name[0x2b] = in_stack_fffffffffffffe58[0x24];
      face_00.material_name[0x2c] = in_stack_fffffffffffffe58[0x25];
      face_00.material_name[0x2d] = in_stack_fffffffffffffe58[0x26];
      face_00.material_name[0x2e] = in_stack_fffffffffffffe58[0x27];
      face_00.material_name[0x2f] = in_stack_fffffffffffffe58[0x28];
      face_00.material_name[0x30] = in_stack_fffffffffffffe58[0x29];
      face_00.material_name[0x31] = in_stack_fffffffffffffe58[0x2a];
      face_00.material_name[0x32] = in_stack_fffffffffffffe58[0x2b];
      face_00.material_name[0x33] = in_stack_fffffffffffffe58[0x2c];
      face_00.material_name[0x34] = in_stack_fffffffffffffe58[0x2d];
      face_00.material_name[0x35] = in_stack_fffffffffffffe58[0x2e];
      face_00.material_name[0x36] = in_stack_fffffffffffffe58[0x2f];
      face_00.material_name[0x37] = in_stack_fffffffffffffe58[0x30];
      face_00.material_name[0x38] = in_stack_fffffffffffffe58[0x31];
      face_00.material_name[0x39] = in_stack_fffffffffffffe58[0x32];
      face_00.material_name[0x3a] = in_stack_fffffffffffffe58[0x33];
      face_00.material_name[0x3b] = in_stack_fffffffffffffe58[0x34];
      face_00.material_name[0x3c] = in_stack_fffffffffffffe58[0x35];
      face_00.material_name[0x3d] = in_stack_fffffffffffffe58[0x36];
      face_00.material_name[0x3e] = in_stack_fffffffffffffe58[0x37];
      face_00.material_name[0x3f] = in_stack_fffffffffffffe58[0x38];
      face_00._65_7_ = in_stack_fffffffffffffe58._57_7_;
      face_00.idx.data = (int *)auVar11._0_8_;
      face_00.idx.length = auVar11._8_4_;
      face_00.idx.capacity = auVar11._12_4_;
      face_00.idx.alloc_category = (char *)auVar11._16_8_;
      face_00.uv_gen_type = in_stack_fffffffffffffe58._88_4_;
      face_00._100_4_ = in_stack_fffffffffffffe58._92_4_;
      face_00._0_8_ = pcVar14;
      face_00.uvs.data = (vec2 *)pcVar12;
      face_00.uvs.length = iVar4;
      face_00.uvs.capacity = iVar13;
      face_00.uvs.alloc_category = pcVar15;
      face_00.start_vertex_in_model = (int)in_stack_fffffffffffffed0;
      face_00.water_dir.x = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
      face_00.water_dir._4_8_ = pcVar16;
      golf_editor_edit_mode_geo_add_face(face_00);
      gs_val_void();
    }
    else {
      pcVar14 = "Need same number of idx and uvs";
LAB_0011af6f:
      gs_val_error(__return_storage_ptr__,pcVar14);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static gs_val_t gs_c_fn_terrain_model_add_face(gs_eval_t *eval, gs_val_t *vals, int num_vals) {
    gs_val_type signature_arg_types[] = { GS_VAL_STRING, GS_VAL_LIST, GS_VAL_LIST };
    int signature_arg_count = sizeof(signature_arg_types) / sizeof(signature_arg_types[0]);;
    gs_val_t sig = gs_c_fn_signature(eval, vals, num_vals, signature_arg_types, signature_arg_count);
    if (sig.is_return) return sig;

    golf_string_t *material_string = vals[0].string_val;
    vec_gs_val_t *idx_list = vals[1].list_val;
    vec_gs_val_t *uvs_list = vals[2].list_val;

    if (idx_list->length != uvs_list->length) {
        return gs_val_error("Need same number of idx and uvs");
    }
    
    vec_int_t idx;
    vec_init(&idx, "geo");

    vec_vec2_t uvs;
    vec_init(&uvs, "geo");

    for (int i = 0; i < idx_list->length; i++) {
        gs_val_t idx_val = gs_eval_cast(eval, idx_list->data[i], GS_VAL_INT);
        if (idx_val.is_return) {
            return gs_val_error("Expected an int in idx list");
        }

        gs_val_t uv_val = gs_eval_cast(eval, uvs_list->data[i], GS_VAL_VEC2);
        if (uv_val.is_return) {
            return gs_val_error("Expected a vec2 in uv list");
        }

        vec_push(&idx, idx_val.int_val);
        vec_push(&uvs, uv_val.vec2_val);
    }

    vec3 water_dir = V3(0, 0, 0);

    golf_geo_face_t face = golf_geo_face(material_string->cstr, idx, GOLF_GEO_FACE_UV_GEN_MANUAL, uvs, water_dir);
    golf_editor_edit_mode_geo_add_face(face);

    return gs_val_void();
}